

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network.c
# Opt level: O2

_Bool sockaddr_is_loopback(sockaddr *sa)

{
  sa_family_t sVar1;
  int iVar2;
  _Bool _Var3;
  
  sVar1 = sa->sa_family;
  if (sVar1 == 1) {
    return true;
  }
  if (sVar1 == 10) {
    if (*(int *)(sa->sa_data + 6) != 0) {
      return false;
    }
    if (*(int *)(sa->sa_data + 10) != 0) {
      return false;
    }
    iVar2._0_2_ = sa[1].sa_family;
    iVar2._2_1_ = sa[1].sa_data[0];
    iVar2._3_1_ = sa[1].sa_data[1];
    if (iVar2 != 0) {
      return false;
    }
    _Var3 = *(int *)(sa[1].sa_data + 2) == 0x1000000;
  }
  else {
    if (sVar1 != 2) {
      return false;
    }
    _Var3 = sa->sa_data[2] == '\x7f';
  }
  return _Var3;
}

Assistant:

static bool sockaddr_is_loopback(struct sockaddr *sa)
{
    union sockaddr_union *u = (union sockaddr_union *)sa;
    switch (u->sa.sa_family) {
      case AF_INET:
        return ipv4_is_loopback(u->sin.sin_addr);
#ifndef NO_IPV6
      case AF_INET6:
        return IN6_IS_ADDR_LOOPBACK(&u->sin6.sin6_addr);
#endif
      case AF_UNIX:
        return true;
      default:
        return false;
    }
}